

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined8 *puVar21;
  float *pfVar22;
  float *pfVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Ref<embree::Geometry> *pRVar26;
  Geometry *pGVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  AABBNodeMB4D *node1;
  ulong uVar53;
  long lVar54;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  undefined1 (*pauVar59) [16];
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  int iVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  NodeRef *pNVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  size_t sVar72;
  ulong uVar73;
  bool bVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar116;
  uint uVar117;
  undefined1 auVar109 [16];
  uint uVar118;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  float fVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar126;
  float fVar131;
  float fVar132;
  undefined1 auVar127 [16];
  float fVar133;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  undefined1 auVar152 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar179 [16];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d00;
  float fStack_cfc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 local_c98;
  float fStack_c90;
  float fStack_c8c;
  undefined1 local_c88 [16];
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined1 local_c48 [8];
  float fStack_c40;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  Scene *scene;
  float fStack_c10;
  float fStack_c0c;
  undefined1 (*local_c00) [16];
  RTCFilterFunctionNArguments args;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float fStack_b2c;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [8];
  float fStack_a70;
  float fStack_a6c;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  uint local_9c8;
  uint uStack_9c4;
  uint uStack_9c0;
  uint uStack_9bc;
  uint local_9b8;
  uint uStack_9b4;
  uint uStack_9b0;
  uint uStack_9ac;
  uint local_9a8;
  uint uStack_9a4;
  uint uStack_9a0;
  uint uStack_99c;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  Scene *pSVar55;
  
  pNVar68 = stack + 1;
  stack[0] = root;
  local_8f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_908 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_918 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_928 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_938 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_948 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_968 = local_928 * 0.99999964;
  local_978 = local_938 * 0.99999964;
  local_958 = local_948 * 0.99999964;
  local_928 = local_928 * 1.0000004;
  local_938 = local_938 * 1.0000004;
  local_948 = local_948 * 1.0000004;
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar63 = (tray->tnear).field_0.i[k];
  local_988._4_4_ = iVar63;
  local_988._0_4_ = iVar63;
  local_988._8_4_ = iVar63;
  local_988._12_4_ = iVar63;
  iVar63 = (tray->tfar).field_0.i[k];
  local_998._4_4_ = iVar63;
  local_998._0_4_ = iVar63;
  local_998._8_4_ = iVar63;
  local_998._12_4_ = iVar63;
  local_7e8 = mm_lookupmask_ps._0_8_;
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  pauVar59 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar74 = true;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  fStack_944 = local_948;
  fStack_940 = local_948;
  fStack_93c = local_948;
  fStack_974 = local_978;
  fStack_970 = local_978;
  fStack_96c = local_978;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_914 = local_918;
  fStack_910 = local_918;
  fStack_90c = local_918;
  fStack_924 = local_928;
  fStack_920 = local_928;
  fStack_91c = local_928;
  fStack_934 = local_938;
  fStack_930 = local_938;
  fStack_92c = local_938;
  fStack_954 = local_958;
  fStack_950 = local_958;
  fStack_94c = local_958;
  fStack_964 = local_968;
  fStack_960 = local_968;
  fStack_95c = local_968;
  local_c00 = pauVar59;
  do {
    sVar72 = pNVar68[-1].ptr;
    pNVar68 = pNVar68 + -1;
    while ((sVar72 & 8) == 0) {
      uVar53 = sVar72 & 0xfffffffffffffff0;
      fVar75 = *(float *)(ray + k * 4 + 0x70);
      pfVar23 = (float *)(uVar53 + 0x80 + uVar71);
      pfVar22 = (float *)(uVar53 + 0x20 + uVar71);
      auVar95._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_8f8) * local_968;
      auVar95._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_8f4) * fStack_964;
      auVar95._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_8f0) * fStack_960;
      auVar95._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_8ec) * fStack_95c;
      auVar95 = maxps(local_988,auVar95);
      pfVar23 = (float *)(uVar53 + 0x80 + uVar61);
      pfVar22 = (float *)(uVar53 + 0x20 + uVar61);
      auVar109._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_908) * local_978;
      auVar109._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_904) * fStack_974;
      auVar109._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_900) * fStack_970;
      auVar109._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_8fc) * fStack_96c;
      pfVar23 = (float *)(uVar53 + 0x80 + uVar73);
      pfVar22 = (float *)(uVar53 + 0x20 + uVar73);
      auVar122._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_918) * local_958;
      auVar122._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_914) * fStack_954;
      auVar122._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_910) * fStack_950;
      auVar122._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_90c) * fStack_94c;
      auVar109 = maxps(auVar109,auVar122);
      auVar95 = maxps(auVar95,auVar109);
      pfVar23 = (float *)(uVar53 + 0x80 + (uVar71 ^ 0x10));
      pfVar22 = (float *)(uVar53 + 0x20 + (uVar71 ^ 0x10));
      auVar120._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_8f8) * local_928;
      auVar120._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_8f4) * fStack_924;
      auVar120._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_8f0) * fStack_920;
      auVar120._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_8ec) * fStack_91c;
      auVar109 = minps(local_998,auVar120);
      pfVar23 = (float *)(uVar53 + 0x80 + (uVar61 ^ 0x10));
      pfVar22 = (float *)(uVar53 + 0x20 + (uVar61 ^ 0x10));
      auVar121._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_908) * local_938;
      auVar121._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_904) * fStack_934;
      auVar121._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_900) * fStack_930;
      auVar121._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_8fc) * fStack_92c;
      pfVar23 = (float *)(uVar53 + 0x80 + (uVar73 ^ 0x10));
      pfVar22 = (float *)(uVar53 + 0x20 + (uVar73 ^ 0x10));
      auVar127._0_4_ = ((*pfVar23 * fVar75 + *pfVar22) - local_918) * local_948;
      auVar127._4_4_ = ((pfVar23[1] * fVar75 + pfVar22[1]) - fStack_914) * fStack_944;
      auVar127._8_4_ = ((pfVar23[2] * fVar75 + pfVar22[2]) - fStack_910) * fStack_940;
      auVar127._12_4_ = ((pfVar23[3] * fVar75 + pfVar22[3]) - fStack_90c) * fStack_93c;
      auVar122 = minps(auVar121,auVar127);
      auVar109 = minps(auVar109,auVar122);
      bVar36 = auVar95._0_4_ <= auVar109._0_4_;
      bVar37 = auVar95._4_4_ <= auVar109._4_4_;
      bVar38 = auVar95._8_4_ <= auVar109._8_4_;
      bVar39 = auVar95._12_4_ <= auVar109._12_4_;
      if (((uint)sVar72 & 7) == 6) {
        bVar36 = (fVar75 < *(float *)(uVar53 + 0xf0) && *(float *)(uVar53 + 0xe0) <= fVar75) &&
                 bVar36;
        bVar37 = (fVar75 < *(float *)(uVar53 + 0xf4) && *(float *)(uVar53 + 0xe4) <= fVar75) &&
                 bVar37;
        bVar38 = (fVar75 < *(float *)(uVar53 + 0xf8) && *(float *)(uVar53 + 0xe8) <= fVar75) &&
                 bVar38;
        bVar39 = (fVar75 < *(float *)(uVar53 + 0xfc) && *(float *)(uVar53 + 0xec) <= fVar75) &&
                 bVar39;
      }
      auVar96._0_4_ = (uint)bVar36 * -0x80000000;
      auVar96._4_4_ = (uint)bVar37 * -0x80000000;
      auVar96._8_4_ = (uint)bVar38 * -0x80000000;
      auVar96._12_4_ = (uint)bVar39 * -0x80000000;
      uVar58 = movmskps((int)pauVar59,auVar96);
      pauVar59 = (undefined1 (*) [16])(ulong)uVar58;
      if (uVar58 == 0) goto LAB_002854ec;
      lVar62 = 0;
      if ((byte)uVar58 != 0) {
        for (; ((byte)uVar58 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
        }
      }
      sVar72 = *(size_t *)(uVar53 + lVar62 * 8);
      uVar58 = (uVar58 & 0xff) - 1 & uVar58 & 0xff;
      pauVar59 = (undefined1 (*) [16])(ulong)uVar58;
      if (uVar58 != 0) {
        pNVar68->ptr = sVar72;
        pNVar68 = pNVar68 + 1;
        lVar62 = 0;
        if (pauVar59 != (undefined1 (*) [16])0x0) {
          for (; (uVar58 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
          }
        }
        sVar72 = *(size_t *)(uVar53 + lVar62 * 8);
        uVar58 = uVar58 - 1 & uVar58;
        uVar64 = (ulong)uVar58;
        if (uVar58 != 0) {
          do {
            pNVar68->ptr = sVar72;
            pNVar68 = pNVar68 + 1;
            pauVar59 = (undefined1 (*) [16])0x0;
            if (uVar64 != 0) {
              for (; (uVar64 >> (long)pauVar59 & 1) == 0;
                  pauVar59 = (undefined1 (*) [16])(*pauVar59 + 1)) {
              }
            }
            sVar72 = *(size_t *)(uVar53 + (long)pauVar59 * 8);
            uVar64 = uVar64 & uVar64 - 1;
          } while (uVar64 != 0);
        }
      }
    }
    uVar53 = (ulong)((uint)sVar72 & 0xf);
    if (uVar53 != 8) {
      uVar64 = sVar72 & 0xfffffffffffffff0;
      pauVar59 = (undefined1 (*) [16])0x0;
      do {
        lVar62 = (long)pauVar59 * 0x60;
        scene = context->scene;
        pRVar26 = (scene->geometries).items;
        pGVar27 = pRVar26[*(uint *)(uVar64 + 0x40 + lVar62)].ptr;
        fVar75 = (pGVar27->time_range).lower;
        local_898 = ((*(float *)(ray + k * 4 + 0x70) - fVar75) /
                    ((pGVar27->time_range).upper - fVar75)) * pGVar27->fnumTimeSegments;
        auVar97 = roundss(ZEXT416((uint)fVar75),ZEXT416((uint)local_898),9);
        fVar75 = pGVar27->fnumTimeSegments + -1.0;
        if (fVar75 <= auVar97._0_4_) {
          auVar97._0_4_ = fVar75;
        }
        fVar75 = 0.0;
        if (0.0 <= auVar97._0_4_) {
          fVar75 = auVar97._0_4_;
        }
        local_898 = local_898 - fVar75;
        lVar69 = (long)(int)fVar75 * 0x38;
        lVar28 = *(long *)(*(long *)&pGVar27[2].numPrimitives + lVar69);
        uVar67 = (ulong)*(uint *)(uVar64 + 4 + lVar62);
        uVar70 = (ulong)*(uint *)(uVar64 + 0x10 + lVar62);
        pfVar22 = (float *)(lVar28 + uVar70 * 4);
        uVar56 = (ulong)*(uint *)(uVar64 + 0x30 + lVar62);
        pfVar23 = (float *)(lVar28 + uVar56 * 4);
        lVar29 = *(long *)&pRVar26[*(uint *)(uVar64 + 0x44 + lVar62)].ptr[2].numPrimitives;
        lVar30 = *(long *)(lVar29 + lVar69);
        uVar58 = *(uint *)(uVar64 + 0x14 + lVar62);
        pfVar1 = (float *)(lVar30 + (ulong)uVar58 * 4);
        lVar54 = (long)((int)fVar75 + 1) * 0x38;
        lVar31 = *(long *)(*(long *)&pGVar27[2].numPrimitives + lVar54);
        pfVar2 = (float *)(lVar31 + (ulong)*(uint *)(uVar64 + lVar62) * 4);
        pfVar3 = (float *)(lVar30 + (ulong)*(uint *)(uVar64 + 0x34 + lVar62) * 4);
        lVar32 = *(long *)&pRVar26[*(uint *)(uVar64 + 0x48 + lVar62)].ptr[2].numPrimitives;
        puVar4 = (undefined8 *)(lVar31 + uVar70 * 4);
        uVar45 = *puVar4;
        uVar46 = puVar4[1];
        lVar33 = *(long *)(lVar32 + lVar69);
        lVar34 = *(long *)(lVar29 + lVar54);
        pfVar5 = (float *)(lVar34 + uVar67 * 4);
        uVar70 = (ulong)*(uint *)(uVar64 + 8 + lVar62);
        pfVar6 = (float *)(lVar33 + uVar70 * 4);
        lVar32 = *(long *)(lVar32 + lVar54);
        pfVar7 = (float *)(lVar32 + uVar70 * 4);
        uVar65 = (ulong)*(uint *)(uVar64 + 0x18 + lVar62);
        pfVar8 = (float *)(lVar33 + uVar65 * 4);
        lVar29 = *(long *)&pRVar26[*(uint *)(uVar64 + 0x4c + lVar62)].ptr[2].numPrimitives;
        pSVar55 = *(Scene **)(lVar29 + lVar69);
        lVar54 = *(long *)(lVar29 + lVar54);
        uVar66 = (ulong)*(uint *)(uVar64 + 0x38 + lVar62);
        pfVar9 = (float *)(lVar33 + uVar66 * 4);
        uVar70 = (ulong)*(uint *)(uVar64 + 0xc + lVar62);
        pfVar10 = (float *)((long)&(pSVar55->super_AccelN).super_Accel.super_AccelData.
                                   super_RefCount._vptr_RefCount + uVar70 * 4);
        uVar57 = (ulong)*(uint *)(uVar64 + 0x1c + lVar62);
        pfVar11 = (float *)((long)&(pSVar55->super_AccelN).super_Accel.super_AccelData.
                                   super_RefCount._vptr_RefCount + uVar57 * 4);
        uVar60 = (ulong)*(uint *)(uVar64 + 0x3c + lVar62);
        pfVar12 = (float *)((long)&(pSVar55->super_AccelN).super_Accel.super_AccelData.
                                   super_RefCount._vptr_RefCount + uVar60 * 4);
        pfVar13 = (float *)(lVar54 + uVar70 * 4);
        local_c98 = CONCAT44(pfVar12[2],pfVar9[2]);
        pfVar14 = (float *)(lVar32 + uVar65 * 4);
        local_d28 = (float)uVar45;
        fStack_d24 = (float)((ulong)uVar45 >> 0x20);
        fStack_d20 = (float)uVar46;
        pfVar15 = (float *)(lVar34 + (ulong)uVar58 * 4);
        pfVar16 = (float *)(lVar54 + uVar57 * 4);
        pfVar17 = (float *)(lVar31 + uVar56 * 4);
        pfVar18 = (float *)(lVar32 + uVar66 * 4);
        pfVar19 = (float *)(lVar34 + local_c98 * 4);
        pfVar20 = (float *)(lVar54 + uVar60 * 4);
        local_8b8 = 1.0 - local_898;
        local_8a8 = *pfVar22 * local_8b8 + local_d28 * local_898;
        fStack_8a4 = *pfVar1 * local_8b8 + *pfVar15 * local_898;
        fStack_8a0 = *pfVar8 * local_8b8 + *pfVar14 * local_898;
        fStack_89c = *pfVar11 * local_8b8 + *pfVar16 * local_898;
        fStack_d1c = (float)((ulong)uVar46 >> 0x20);
        fVar139 = pfVar22[1] * local_8b8 + fStack_d24 * local_898;
        fVar140 = pfVar1[1] * local_8b8 + pfVar15[1] * local_898;
        fVar141 = pfVar8[1] * local_8b8 + pfVar14[1] * local_898;
        fVar142 = pfVar11[1] * local_8b8 + pfVar16[1] * local_898;
        fVar155 = pfVar22[2] * local_8b8 + fStack_d20 * local_898;
        fVar159 = pfVar1[2] * local_8b8 + pfVar15[2] * local_898;
        fVar162 = pfVar8[2] * local_8b8 + fStack_d20 * local_898;
        fVar165 = pfVar11[2] * local_8b8 + fStack_d1c * local_898;
        fStack_894 = local_898;
        fStack_890 = local_898;
        fStack_88c = local_898;
        fVar76 = *pfVar23 * local_8b8 + *pfVar17 * local_898;
        fVar89 = *pfVar3 * local_8b8 + *pfVar19 * local_898;
        fVar91 = *pfVar9 * local_8b8 + *pfVar18 * local_898;
        fVar93 = *pfVar12 * local_8b8 + *pfVar20 * local_898;
        local_8e8 = pfVar23[1] * local_8b8 + pfVar17[1] * local_898;
        fStack_8e4 = pfVar3[1] * local_8b8 + pfVar19[1] * local_898;
        fStack_8e0 = pfVar9[1] * local_8b8 + pfVar18[1] * local_898;
        fStack_8dc = pfVar12[1] * local_8b8 + pfVar20[1] * local_898;
        fStack_8b4 = local_8b8;
        fStack_8b0 = local_8b8;
        fStack_8ac = local_8b8;
        fVar126 = pfVar23[2] * local_8b8 + pfVar17[2] * local_898;
        fVar131 = pfVar3[2] * local_8b8 + pfVar19[2] * local_898;
        fVar132 = fStack_ca0 * local_8b8 + pfVar18[2] * local_898;
        fVar133 = fStack_c9c * local_8b8 + pfVar20[2] * local_898;
        fVar75 = *(float *)(ray + k * 4);
        fStack_b2c = *(float *)(ray + k * 4 + 0x10);
        fStack_b1c = *(float *)(ray + k * 4 + 0x20);
        fVar119 = (pfVar14[2] * local_8b8 + *pfVar2 * local_898) - fVar75;
        fVar125 = (pfVar16[2] * local_8b8 + *pfVar5 * local_898) - fVar75;
        fStack_d10 = (fStack_d10 * local_8b8 + *pfVar7 * local_898) - fVar75;
        fStack_d0c = (fStack_d0c * local_8b8 + *pfVar13 * local_898) - fVar75;
        local_7f8 = (*(float *)(lVar28 + (ulong)*(uint *)(uVar64 + lVar62) * 4 + 4) * local_8b8 +
                    pfVar2[1] * local_898) - fStack_b2c;
        fStack_7f4 = (*(float *)(lVar30 + uVar67 * 4 + 4) * local_8b8 + pfVar5[1] * local_898) -
                     fStack_b2c;
        fStack_7f0 = (pfVar6[1] * local_8b8 + pfVar7[1] * local_898) - fStack_b2c;
        fStack_7ec = (pfVar10[1] * local_8b8 + pfVar13[1] * local_898) - fStack_b2c;
        fVar156 = (*pfVar6 * local_8b8 + pfVar2[2] * local_898) - fStack_b1c;
        fVar160 = (*pfVar10 * local_8b8 + pfVar5[2] * local_898) - fStack_b1c;
        fVar163 = (fStack_d00 * local_8b8 + pfVar7[2] * local_898) - fStack_b1c;
        fVar166 = (fStack_cfc * local_8b8 + pfVar13[2] * local_898) - fStack_b1c;
        fVar171 = local_8a8 - fVar75;
        fVar173 = fStack_8a4 - fVar75;
        fVar175 = fStack_8a0 - fVar75;
        fVar176 = fStack_89c - fVar75;
        fVar151 = fVar76 - fVar75;
        fVar153 = fVar89 - fVar75;
        fVar154 = fVar91 - fVar75;
        fVar75 = fVar93 - fVar75;
        local_b18 = local_8e8 - fStack_b2c;
        fStack_b14 = fStack_8e4 - fStack_b2c;
        fStack_b10 = fStack_8e0 - fStack_b2c;
        fStack_b0c = fStack_8dc - fStack_b2c;
        local_c98._0_4_ = fVar126 - fStack_b1c;
        local_c98._4_4_ = fVar131 - fStack_b1c;
        fStack_c90 = fVar132 - fStack_b1c;
        fStack_c8c = fVar133 - fStack_b1c;
        local_808 = fVar151 - fVar119;
        fStack_804 = fVar153 - fVar125;
        fStack_800 = fVar154 - fStack_d10;
        fStack_7fc = fVar75 - fStack_d0c;
        local_828 = local_b18 - local_7f8;
        fStack_824 = fStack_b14 - fStack_7f4;
        fStack_820 = fStack_b10 - fStack_7f0;
        fStack_81c = fStack_b0c - fStack_7ec;
        local_818 = (float)local_c98 - fVar156;
        fStack_814 = local_c98._4_4_ - fVar160;
        fStack_810 = fStack_c90 - fVar163;
        fStack_80c = fStack_c8c - fVar166;
        fStack_c60 = *(float *)(ray + k * 4 + 0x50);
        fVar183 = *(float *)(ray + k * 4 + 0x60);
        local_c78 = *(float *)(ray + k * 4 + 0x40);
        fVar157 = (local_828 * ((float)local_c98 + fVar156) - (local_b18 + local_7f8) * local_818) *
                  local_c78 +
                  ((fVar151 + fVar119) * local_818 - ((float)local_c98 + fVar156) * local_808) *
                  fStack_c60 +
                  (local_808 * (local_b18 + local_7f8) - (fVar151 + fVar119) * local_828) * fVar183;
        fVar161 = (fStack_824 * (local_c98._4_4_ + fVar160) - (fStack_b14 + fStack_7f4) * fStack_814
                  ) * local_c78 +
                  ((fVar153 + fVar125) * fStack_814 - (local_c98._4_4_ + fVar160) * fStack_804) *
                  fStack_c60 +
                  (fStack_804 * (fStack_b14 + fStack_7f4) - (fVar153 + fVar125) * fStack_824) *
                  fVar183;
        fVar164 = (fStack_820 * (fStack_c90 + fVar163) - (fStack_b10 + fStack_7f0) * fStack_810) *
                  local_c78 +
                  ((fVar154 + fStack_d10) * fStack_810 - (fStack_c90 + fVar163) * fStack_800) *
                  fStack_c60 +
                  (fStack_800 * (fStack_b10 + fStack_7f0) - (fVar154 + fStack_d10) * fStack_820) *
                  fVar183;
        fVar167 = (fStack_81c * (fStack_c8c + fVar166) - (fStack_b0c + fStack_7ec) * fStack_80c) *
                  local_c78 +
                  ((fVar75 + fStack_d0c) * fStack_80c - (fStack_c8c + fVar166) * fStack_7fc) *
                  fStack_c60 +
                  (fStack_7fc * (fStack_b0c + fStack_7ec) - (fVar75 + fStack_d0c) * fStack_81c) *
                  fVar183;
        local_b78 = fVar139 - fStack_b2c;
        fStack_b74 = fVar140 - fStack_b2c;
        fStack_b70 = fVar141 - fStack_b2c;
        fStack_b6c = fVar142 - fStack_b2c;
        local_b68 = fVar155 - fStack_b1c;
        fStack_b64 = fVar159 - fStack_b1c;
        fStack_b60 = fVar162 - fStack_b1c;
        fStack_b5c = fVar165 - fStack_b1c;
        local_848 = fVar119 - fVar171;
        fStack_844 = fVar125 - fVar173;
        fStack_840 = fStack_d10 - fVar175;
        fStack_83c = fStack_d0c - fVar176;
        fVar77 = local_7f8 - local_b78;
        fVar90 = fStack_7f4 - fStack_b74;
        fVar92 = fStack_7f0 - fStack_b70;
        fVar94 = fStack_7ec - fStack_b6c;
        local_838 = fVar156 - local_b68;
        fStack_834 = fVar160 - fStack_b64;
        fStack_830 = fVar163 - fStack_b60;
        fStack_82c = fVar166 - fStack_b5c;
        local_878._0_4_ =
             (fVar77 * (fVar156 + local_b68) - (local_7f8 + local_b78) * local_838) * local_c78 +
             ((fVar119 + fVar171) * local_838 - (fVar156 + local_b68) * local_848) * fStack_c60 +
             (local_848 * (local_7f8 + local_b78) - (fVar119 + fVar171) * fVar77) * fVar183;
        local_878._4_4_ =
             (fVar90 * (fVar160 + fStack_b64) - (fStack_7f4 + fStack_b74) * fStack_834) * local_c78
             + ((fVar125 + fVar173) * fStack_834 - (fVar160 + fStack_b64) * fStack_844) * fStack_c60
               + (fStack_844 * (fStack_7f4 + fStack_b74) - (fVar125 + fVar173) * fVar90) * fVar183;
        local_878._8_4_ =
             (fVar92 * (fVar163 + fStack_b60) - (fStack_7f0 + fStack_b70) * fStack_830) * local_c78
             + ((fStack_d10 + fVar175) * fStack_830 - (fVar163 + fStack_b60) * fStack_840) *
               fStack_c60 +
               (fStack_840 * (fStack_7f0 + fStack_b70) - (fStack_d10 + fVar175) * fVar92) * fVar183;
        local_878._12_4_ =
             (fVar94 * (fVar166 + fStack_b5c) - (fStack_7ec + fStack_b6c) * fStack_82c) * local_c78
             + ((fStack_d0c + fVar176) * fStack_82c - (fVar166 + fStack_b5c) * fStack_83c) *
               fStack_c60 +
               (fStack_83c * (fStack_7ec + fStack_b6c) - (fStack_d0c + fVar176) * fVar94) * fVar183;
        fVar134 = fVar171 - fVar151;
        fVar136 = fVar173 - fVar153;
        fVar137 = fVar175 - fVar154;
        fVar138 = fVar176 - fVar75;
        fVar143 = local_b78 - local_b18;
        fVar146 = fStack_b74 - fStack_b14;
        fVar147 = fStack_b70 - fStack_b10;
        fVar148 = fStack_b6c - fStack_b0c;
        fVar178 = local_b68 - (float)local_c98;
        fVar180 = fStack_b64 - local_c98._4_4_;
        fVar181 = fStack_b60 - fStack_c90;
        fVar182 = fStack_b5c - fStack_c8c;
        local_b58 = local_b78 + local_b18;
        fStack_b54 = fStack_b74 + fStack_b14;
        fStack_b50 = fStack_b70 + fStack_b10;
        fStack_b4c = fStack_b6c + fStack_b0c;
        local_b48 = local_b68 + (float)local_c98;
        fStack_b44 = fStack_b64 + local_c98._4_4_;
        fStack_b40 = fStack_b60 + fStack_c90;
        fStack_b3c = fStack_b5c + fStack_c8c;
        _local_c68 = CONCAT44(fStack_c60,fStack_c60);
        auVar98._0_4_ =
             (fVar143 * local_b48 - local_b58 * fVar178) * local_c78 +
             ((fVar151 + fVar171) * fVar178 - fVar134 * local_b48) * fStack_c60 +
             (fVar134 * local_b58 - (fVar151 + fVar171) * fVar143) * fVar183;
        auVar98._4_4_ =
             (fVar146 * fStack_b44 - fStack_b54 * fVar180) * local_c78 +
             ((fVar153 + fVar173) * fVar180 - fVar136 * fStack_b44) * fStack_c60 +
             (fVar136 * fStack_b54 - (fVar153 + fVar173) * fVar146) * fVar183;
        auVar98._8_4_ =
             (fVar147 * fStack_b40 - fStack_b50 * fVar181) * local_c78 +
             ((fVar154 + fVar175) * fVar181 - fVar137 * fStack_b40) * fStack_c60 +
             (fVar137 * fStack_b50 - (fVar154 + fVar175) * fVar147) * fVar183;
        auVar98._12_4_ =
             (fVar148 * fStack_b3c - fStack_b4c * fVar182) * local_c78 +
             ((fVar75 + fVar176) * fVar182 - fVar138 * fStack_b3c) * fStack_c60 +
             (fVar138 * fStack_b4c - (fVar75 + fVar176) * fVar148) * fVar183;
        fVar171 = fVar157 + local_878._0_4_ + auVar98._0_4_;
        fVar173 = fVar161 + local_878._4_4_ + auVar98._4_4_;
        fVar175 = fVar164 + local_878._8_4_ + auVar98._8_4_;
        fVar176 = fVar167 + local_878._12_4_ + auVar98._12_4_;
        auVar78._8_4_ = fVar164;
        auVar78._0_8_ = CONCAT44(fVar161,fVar157);
        auVar78._12_4_ = fVar167;
        auVar95 = minps(auVar78,local_878);
        auVar95 = minps(auVar95,auVar98);
        auVar128._8_4_ = fVar164;
        auVar128._0_8_ = CONCAT44(fVar161,fVar157);
        auVar128._12_4_ = fVar167;
        auVar109 = maxps(auVar128,local_878);
        auVar109 = maxps(auVar109,auVar98);
        uVar58 = (uint)DAT_01f7b6c0;
        uVar116 = DAT_01f7b6c0._4_4_;
        uVar117 = DAT_01f7b6c0._8_4_;
        uVar118 = DAT_01f7b6c0._12_4_;
        fVar75 = (float)((uint)fVar171 & uVar58) * 1.1920929e-07;
        fVar151 = (float)((uint)fVar173 & uVar116) * 1.1920929e-07;
        fVar153 = (float)((uint)fVar175 & uVar117) * 1.1920929e-07;
        fVar154 = (float)((uint)fVar176 & uVar118) * 1.1920929e-07;
        auVar129._4_4_ = -(uint)(auVar109._4_4_ <= fVar151);
        auVar129._0_4_ = -(uint)(auVar109._0_4_ <= fVar75);
        auVar129._8_4_ = -(uint)(auVar109._8_4_ <= fVar153);
        auVar129._12_4_ = -(uint)(auVar109._12_4_ <= fVar154);
        auVar79._4_4_ = -(uint)(-fVar151 <= auVar95._4_4_);
        auVar79._0_4_ = -(uint)(-fVar75 <= auVar95._0_4_);
        auVar79._8_4_ = -(uint)(-fVar153 <= auVar95._8_4_);
        auVar79._12_4_ = -(uint)(-fVar154 <= auVar95._12_4_);
        auVar129 = auVar129 | auVar79;
        lVar29 = uVar64 + lVar62;
        uVar70 = (ulong)*(uint *)(uVar64 + 0x20 + lVar62);
        uVar60 = (ulong)*(uint *)(uVar64 + 0x24 + lVar62);
        uVar56 = (ulong)*(uint *)(uVar64 + 0x28 + lVar62);
        uVar57 = (ulong)*(uint *)(uVar64 + 0x2c + lVar62);
        iVar63 = movmskps(pfVar9[2],auVar129);
        puVar4 = (undefined8 *)(lVar28 + uVar70 * 4);
        uVar45 = *puVar4;
        puVar21 = (undefined8 *)(lVar31 + uVar70 * 4);
        uVar46 = *puVar21;
        uVar47 = puVar21[1];
        puVar21 = (undefined8 *)(lVar30 + uVar60 * 4);
        local_8c8 = *puVar21;
        uStack_8c0 = puVar21[1];
        puVar21 = (undefined8 *)(lVar34 + uVar60 * 4);
        local_c58 = *puVar21;
        uStack_c50 = puVar21[1];
        puVar21 = (undefined8 *)(lVar33 + uVar56 * 4);
        local_8d8 = *puVar21;
        uStack_8d0 = puVar21[1];
        puVar21 = (undefined8 *)(lVar32 + uVar56 * 4);
        uVar48 = *puVar21;
        uVar49 = puVar21[1];
        local_c38 = (float)uVar48;
        fStack_c34 = (float)((ulong)uVar48 >> 0x20);
        fStack_c30 = (float)uVar49;
        fStack_c2c = (float)((ulong)uVar49 >> 0x20);
        _local_c48 = *(undefined1 (*) [16])
                      ((long)&(pSVar55->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                              _vptr_RefCount + uVar57 * 4);
        puVar21 = (undefined8 *)(lVar54 + uVar57 * 4);
        uVar48 = *puVar21;
        uVar49 = puVar21[1];
        local_c28 = (float)uVar48;
        fStack_c24 = (float)((ulong)uVar48 >> 0x20);
        fStack_c20 = (float)uVar49;
        fStack_c1c = (float)((ulong)uVar49 >> 0x20);
        local_cc8 = (float)uVar45;
        fStack_cc4 = (float)((ulong)uVar45 >> 0x20);
        fStack_cc0 = (float)puVar4[1];
        auVar95 = _DAT_01f7b6c0;
        fStack_c6c = local_c78;
        if (iVar63 != 0) {
          local_858 = fVar143;
          fStack_854 = fVar146;
          fStack_850 = fVar147;
          fStack_84c = fVar148;
          local_868 = fVar178;
          fStack_864 = fVar180;
          fStack_860 = fVar181;
          fStack_85c = fVar182;
          auVar149._0_4_ = fVar77 * fVar178 - fVar143 * local_838;
          auVar149._4_4_ = fVar90 * fVar180 - fVar146 * fStack_834;
          auVar149._8_4_ = fVar92 * fVar181 - fVar147 * fStack_830;
          auVar149._12_4_ = fVar94 * fVar182 - fVar148 * fStack_82c;
          auVar80._4_4_ =
               -(uint)((float)((uint)(fVar90 * fStack_814) & uVar116) <
                      (float)((uint)(fVar146 * fStack_834) & uVar116));
          auVar80._0_4_ =
               -(uint)((float)((uint)(fVar77 * local_818) & uVar58) <
                      (float)((uint)(fVar143 * local_838) & uVar58));
          auVar80._8_4_ =
               -(uint)((float)((uint)(fVar92 * fStack_810) & uVar117) <
                      (float)((uint)(fVar147 * fStack_830) & uVar117));
          auVar80._12_4_ =
               -(uint)((float)((uint)(fVar94 * fStack_80c) & uVar118) <
                      (float)((uint)(fVar148 * fStack_82c) & uVar118));
          auVar42._4_4_ = fStack_824 * fStack_834 - fVar90 * fStack_814;
          auVar42._0_4_ = local_828 * local_838 - fVar77 * local_818;
          auVar42._8_4_ = fStack_820 * fStack_830 - fVar92 * fStack_810;
          auVar42._12_4_ = fStack_81c * fStack_82c - fVar94 * fStack_80c;
          local_a68 = blendvps(auVar149,auVar42,auVar80);
          auVar144._0_4_ = local_818 * local_848 - local_808 * local_838;
          auVar144._4_4_ = fStack_814 * fStack_844 - fStack_804 * fStack_834;
          auVar144._8_4_ = fStack_810 * fStack_840 - fStack_800 * fStack_830;
          auVar144._12_4_ = fStack_80c * fStack_83c - fStack_7fc * fStack_82c;
          auVar135._0_4_ = fVar134 * local_838 - local_848 * fVar178;
          auVar135._4_4_ = fVar136 * fStack_834 - fStack_844 * fVar180;
          auVar135._8_4_ = fVar137 * fStack_830 - fStack_840 * fVar181;
          auVar135._12_4_ = fVar138 * fStack_82c - fStack_83c * fVar182;
          auVar81._4_4_ =
               -(uint)((float)((uint)(fStack_804 * fStack_834) & uVar116) <
                      (float)((uint)(fStack_844 * fVar180) & uVar116));
          auVar81._0_4_ =
               -(uint)((float)((uint)(local_808 * local_838) & uVar58) <
                      (float)((uint)(local_848 * fVar178) & uVar58));
          auVar81._8_4_ =
               -(uint)((float)((uint)(fStack_800 * fStack_830) & uVar117) <
                      (float)((uint)(fStack_840 * fVar181) & uVar117));
          auVar81._12_4_ =
               -(uint)((float)((uint)(fStack_7fc * fStack_82c) & uVar118) <
                      (float)((uint)(fStack_83c * fVar182) & uVar118));
          local_a58 = blendvps(auVar135,auVar144,auVar81);
          auVar179._0_4_ = local_848 * fVar143 - fVar134 * fVar77;
          auVar179._4_4_ = fStack_844 * fVar146 - fVar136 * fVar90;
          auVar179._8_4_ = fStack_840 * fVar147 - fVar137 * fVar92;
          auVar179._12_4_ = fStack_83c * fVar148 - fVar138 * fVar94;
          auVar82._4_4_ =
               -(uint)((float)((uint)(fStack_844 * fStack_824) & uVar116) <
                      (float)((uint)(fVar136 * fVar90) & uVar116));
          auVar82._0_4_ =
               -(uint)((float)((uint)(local_848 * local_828) & uVar58) <
                      (float)((uint)(fVar134 * fVar77) & uVar58));
          auVar82._8_4_ =
               -(uint)((float)((uint)(fStack_840 * fStack_820) & uVar117) <
                      (float)((uint)(fVar137 * fVar92) & uVar117));
          auVar82._12_4_ =
               -(uint)((float)((uint)(fStack_83c * fStack_81c) & uVar118) <
                      (float)((uint)(fVar138 * fVar94) & uVar118));
          auVar40._4_4_ = fStack_804 * fVar90 - fStack_844 * fStack_824;
          auVar40._0_4_ = local_808 * fVar77 - local_848 * local_828;
          auVar40._8_4_ = fStack_800 * fVar92 - fStack_840 * fStack_820;
          auVar40._12_4_ = fStack_7fc * fVar94 - fStack_83c * fStack_81c;
          local_a48 = blendvps(auVar179,auVar40,auVar82);
          fVar75 = local_c78 * local_a68._0_4_ +
                   fStack_c60 * local_a58._0_4_ + fVar183 * local_a48._0_4_;
          fVar77 = local_c78 * local_a68._4_4_ +
                   fStack_c60 * local_a58._4_4_ + fVar183 * local_a48._4_4_;
          fVar90 = local_c78 * local_a68._8_4_ +
                   fStack_c60 * local_a58._8_4_ + fVar183 * local_a48._8_4_;
          fVar92 = local_c78 * local_a68._12_4_ +
                   fStack_c60 * local_a58._12_4_ + fVar183 * local_a48._12_4_;
          auVar99._0_4_ = fVar75 + fVar75;
          auVar99._4_4_ = fVar77 + fVar77;
          auVar99._8_4_ = fVar90 + fVar90;
          auVar99._12_4_ = fVar92 + fVar92;
          auVar110._0_4_ = local_7f8 * local_a58._0_4_ + fVar156 * local_a48._0_4_;
          auVar110._4_4_ = fStack_7f4 * local_a58._4_4_ + fVar160 * local_a48._4_4_;
          auVar110._8_4_ = fStack_7f0 * local_a58._8_4_ + fVar163 * local_a48._8_4_;
          auVar110._12_4_ = fStack_7ec * local_a58._12_4_ + fVar166 * local_a48._12_4_;
          fVar119 = fVar119 * local_a68._0_4_ + auVar110._0_4_;
          fVar125 = fVar125 * local_a68._4_4_ + auVar110._4_4_;
          fVar134 = fStack_d10 * local_a68._8_4_ + auVar110._8_4_;
          fVar136 = fStack_d0c * local_a68._12_4_ + auVar110._12_4_;
          auVar109 = rcpps(auVar110,auVar99);
          fVar75 = auVar109._0_4_;
          fVar77 = auVar109._4_4_;
          fVar92 = auVar109._8_4_;
          fVar94 = auVar109._12_4_;
          fVar151 = (float)DAT_01f7ba10;
          fVar153 = DAT_01f7ba10._4_4_;
          fVar154 = DAT_01f7ba10._12_4_;
          fVar90 = DAT_01f7ba10._8_4_;
          local_a78._0_4_ =
               ((fVar151 - auVar99._0_4_ * fVar75) * fVar75 + fVar75) * (fVar119 + fVar119);
          local_a78._4_4_ =
               ((fVar153 - auVar99._4_4_ * fVar77) * fVar77 + fVar77) * (fVar125 + fVar125);
          fStack_a70 = ((fVar90 - auVar99._8_4_ * fVar92) * fVar92 + fVar92) * (fVar134 + fVar134);
          fStack_a6c = ((fVar154 - auVar99._12_4_ * fVar94) * fVar94 + fVar94) * (fVar136 + fVar136)
          ;
          fVar75 = *(float *)(ray + k * 4 + 0x80);
          fVar77 = *(float *)(ray + k * 4 + 0x30);
          auVar111._0_4_ =
               -(uint)(fVar77 <= (float)local_a78._0_4_ && (float)local_a78._0_4_ <= fVar75) &
               auVar129._0_4_;
          auVar111._4_4_ =
               -(uint)(fVar77 <= (float)local_a78._4_4_ && (float)local_a78._4_4_ <= fVar75) &
               auVar129._4_4_;
          auVar111._8_4_ = -(uint)(fStack_a70 <= fVar75 && fVar77 <= fStack_a70) & auVar129._8_4_;
          auVar111._12_4_ = -(uint)(fVar77 <= fStack_a6c && fStack_a6c <= fVar75) & auVar129._12_4_;
          uVar52 = movmskps((int)pSVar55,auVar111);
          pSVar55 = (Scene *)(ulong)uVar52;
          if (uVar52 != 0) {
            auVar112._0_4_ = auVar111._0_4_ & -(uint)(auVar99._0_4_ != 0.0);
            auVar112._4_4_ = auVar111._4_4_ & -(uint)(auVar99._4_4_ != 0.0);
            auVar112._8_4_ = auVar111._8_4_ & -(uint)(auVar99._8_4_ != 0.0);
            auVar112._12_4_ = auVar111._12_4_ & -(uint)(auVar99._12_4_ != 0.0);
            uVar52 = movmskps(uVar52,auVar112);
            pSVar55 = (Scene *)(ulong)uVar52;
            if (uVar52 != 0) {
              auVar50._4_4_ = fVar173;
              auVar50._0_4_ = fVar171;
              auVar50._8_4_ = fVar175;
              auVar50._12_4_ = fVar176;
              local_a38._8_8_ = uStack_7e0;
              local_a38._0_8_ = local_7e8;
              auVar109 = rcpps(auVar112,auVar50);
              fVar183 = auVar109._0_4_;
              fVar77 = auVar109._4_4_;
              fVar92 = auVar109._8_4_;
              fVar94 = auVar109._12_4_;
              fVar183 = (float)(-(uint)(1e-18 <= (float)((uint)fVar171 & uVar58)) &
                               (uint)((fVar151 - fVar171 * fVar183) * fVar183 + fVar183));
              fVar77 = (float)(-(uint)(1e-18 <= (float)((uint)fVar173 & uVar116)) &
                              (uint)((fVar153 - fVar173 * fVar77) * fVar77 + fVar77));
              fVar92 = (float)(-(uint)(1e-18 <= (float)((uint)fVar175 & uVar117)) &
                              (uint)((fVar90 - fVar175 * fVar92) * fVar92 + fVar92));
              fVar94 = (float)(-(uint)(1e-18 <= (float)((uint)fVar176 & uVar118)) &
                              (uint)((fVar154 - fVar176 * fVar94) * fVar94 + fVar94));
              auVar168._0_4_ = fVar157 * fVar183;
              auVar168._4_4_ = fVar161 * fVar77;
              auVar168._8_4_ = fVar164 * fVar92;
              auVar168._12_4_ = fVar167 * fVar94;
              auVar109 = minps(auVar168,_DAT_01f7ba10);
              auVar184._0_4_ = fVar183 * local_878._0_4_;
              auVar184._4_4_ = fVar77 * local_878._4_4_;
              auVar184._8_4_ = fVar92 * local_878._8_4_;
              auVar184._12_4_ = fVar94 * local_878._12_4_;
              auVar122 = minps(auVar184,_DAT_01f7ba10);
              auVar100._0_4_ = fVar151 - auVar109._0_4_;
              auVar100._4_4_ = fVar153 - auVar109._4_4_;
              auVar100._8_4_ = fVar90 - auVar109._8_4_;
              auVar100._12_4_ = fVar154 - auVar109._12_4_;
              auVar113._0_4_ = fVar151 - auVar122._0_4_;
              auVar113._4_4_ = fVar153 - auVar122._4_4_;
              auVar113._8_4_ = fVar90 - auVar122._8_4_;
              auVar113._12_4_ = fVar154 - auVar122._12_4_;
              local_a98 = blendvps(auVar109,auVar100,local_a38);
              local_a88 = blendvps(auVar122,auVar113,local_a38);
              uVar70 = (ulong)(byte)uVar52;
              fStack_c74 = local_c78;
              fStack_c70 = local_c78;
              fStack_c5c = fStack_c60;
              do {
                uVar56 = 0;
                if (uVar70 != 0) {
                  for (; (uVar70 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                  }
                }
                local_9c8 = *(uint *)(lVar29 + 0x40 + uVar56 * 4);
                pGVar27 = (scene->geometries).items[local_9c8].ptr;
                if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0028550c;
                  local_9f8 = *(undefined4 *)(local_a98 + uVar56 * 4);
                  uVar24 = *(undefined4 *)(local_a88 + uVar56 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a78 + uVar56 * 4);
                  args.context = context->user;
                  local_9d8._4_4_ = *(undefined4 *)(lVar29 + 0x50 + uVar56 * 4);
                  local_9e8._4_4_ = uVar24;
                  local_9e8._0_4_ = uVar24;
                  local_9e8._8_4_ = uVar24;
                  local_9e8._12_4_ = uVar24;
                  local_a28._4_4_ = *(undefined4 *)(local_a68 + uVar56 * 4);
                  uVar24 = *(undefined4 *)(local_a58 + uVar56 * 4);
                  uVar25 = *(undefined4 *)(local_a48 + uVar56 * 4);
                  local_a18._4_4_ = uVar24;
                  local_a18._0_4_ = uVar24;
                  local_a18._8_4_ = uVar24;
                  local_a18._12_4_ = uVar24;
                  local_a08._4_4_ = uVar25;
                  local_a08._0_4_ = uVar25;
                  local_a08._8_4_ = uVar25;
                  local_a08._12_4_ = uVar25;
                  local_a28._0_4_ = local_a28._4_4_;
                  local_a28._8_4_ = local_a28._4_4_;
                  local_a28._12_4_ = local_a28._4_4_;
                  uStack_9f4 = local_9f8;
                  uStack_9f0 = local_9f8;
                  uStack_9ec = local_9f8;
                  local_9d8._0_4_ = local_9d8._4_4_;
                  local_9d8._8_4_ = local_9d8._4_4_;
                  local_9d8._12_4_ = local_9d8._4_4_;
                  uStack_9c4 = local_9c8;
                  uStack_9c0 = local_9c8;
                  uStack_9bc = local_9c8;
                  local_9b8 = (args.context)->instID[0];
                  uStack_9b4 = local_9b8;
                  uStack_9b0 = local_9b8;
                  uStack_9ac = local_9b8;
                  local_9a8 = (args.context)->instPrimID[0];
                  uStack_9a4 = local_9a8;
                  uStack_9a0 = local_9a8;
                  uStack_99c = local_9a8;
                  local_c88 = *local_c00;
                  args.valid = (int *)local_c88;
                  args.geometryUserPtr = pGVar27->userPtr;
                  args.hit = (RTCHitN *)local_a28;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar27->occlusionFilterN)(&args);
                    auVar95 = _DAT_01f7b6c0;
                  }
                  if (local_c88 == (undefined1  [16])0x0) {
                    auVar101._8_4_ = 0xffffffff;
                    auVar101._0_8_ = 0xffffffffffffffff;
                    auVar101._12_4_ = 0xffffffff;
                    auVar101 = auVar101 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var35 = context->args->filter;
                    if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var35)(&args);
                      auVar95 = _DAT_01f7b6c0;
                    }
                    auVar83._0_4_ = -(uint)(local_c88._0_4_ == 0);
                    auVar83._4_4_ = -(uint)(local_c88._4_4_ == 0);
                    auVar83._8_4_ = -(uint)(local_c88._8_4_ == 0);
                    auVar83._12_4_ = -(uint)(local_c88._12_4_ == 0);
                    auVar101 = auVar83 ^ _DAT_01f7ae20;
                    auVar109 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                        auVar83);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar109;
                  }
                  if ((_DAT_01f7bb20 & auVar101) != (undefined1  [16])0x0) goto LAB_0028550c;
                  *(float *)(ray + k * 4 + 0x80) = fVar75;
                }
                uVar70 = uVar70 ^ 1L << (uVar56 & 0x3f);
              } while (uVar70 != 0);
              fStack_b2c = *(float *)(ray + k * 4 + 0x10);
              fStack_b1c = *(float *)(ray + k * 4 + 0x20);
              fStack_c6c = *(float *)(ray + k * 4 + 0x40);
              fStack_c60 = *(float *)(ray + k * 4 + 0x50);
              fVar183 = *(float *)(ray + k * 4 + 0x60);
              local_b18 = local_8e8 - fStack_b2c;
              fStack_b14 = fStack_8e4 - fStack_b2c;
              fStack_b10 = fStack_8e0 - fStack_b2c;
              fStack_b0c = fStack_8dc - fStack_b2c;
              local_c98._0_4_ = fVar126 - fStack_b1c;
              local_c98._4_4_ = fVar131 - fStack_b1c;
              fStack_c90 = fVar132 - fStack_b1c;
              fStack_c8c = fVar133 - fStack_b1c;
              local_b78 = fVar139 - fStack_b2c;
              fStack_b74 = fVar140 - fStack_b2c;
              fStack_b70 = fVar141 - fStack_b2c;
              fStack_b6c = fVar142 - fStack_b2c;
              local_b68 = fVar155 - fStack_b1c;
              fStack_b64 = fVar159 - fStack_b1c;
              fStack_b60 = fVar162 - fStack_b1c;
              fStack_b5c = fVar165 - fStack_b1c;
              local_b58 = local_b18 + local_b78;
              fStack_b54 = fStack_b14 + fStack_b74;
              fStack_b50 = fStack_b10 + fStack_b70;
              fStack_b4c = fStack_b0c + fStack_b6c;
              local_b48 = (float)local_c98 + local_b68;
              fStack_b44 = local_c98._4_4_ + fStack_b64;
              fStack_b40 = fStack_c90 + fStack_b60;
              fStack_b3c = fStack_c8c + fStack_b5c;
              pSVar55 = scene;
            }
          }
        }
        local_ba8 = (float)uVar46;
        fStack_ba4 = (float)((ulong)uVar46 >> 0x20);
        fStack_ba0 = (float)uVar47;
        fVar157 = (fStack_cc4 * local_8b8 + fStack_ba4 * local_898) - fStack_b2c;
        fVar159 = (local_8c8._4_4_ * fStack_8b4 + local_c58._4_4_ * fStack_894) - fStack_b2c;
        fVar160 = (local_8d8._4_4_ * fStack_8b0 + fStack_c34 * fStack_890) - fStack_b2c;
        fStack_b2c = ((float)local_c48._4_4_ * fStack_8ac + fStack_c24 * fStack_88c) - fStack_b2c;
        fVar131 = (fStack_cc0 * local_8b8 + fStack_ba0 * local_898) - fStack_b1c;
        fVar132 = ((float)uStack_8c0 * fStack_8b4 + (float)uStack_c50 * fStack_894) - fStack_b1c;
        fVar133 = ((float)uStack_8d0 * fStack_8b0 + fStack_c30 * fStack_890) - fStack_b1c;
        fStack_b1c = (fStack_c40 * fStack_8ac + fStack_c20 * fStack_88c) - fStack_b1c;
        fVar75 = *(float *)(ray + k * 4);
        fVar176 = (local_cc8 * local_8b8 + local_ba8 * local_898) - fVar75;
        fVar126 = ((float)local_8c8 * fStack_8b4 + (float)local_c58 * fStack_894) - fVar75;
        fStack_c10 = ((float)local_8d8 * fStack_8b0 + local_c38 * fStack_890) - fVar75;
        fStack_c0c = ((float)local_c48._0_4_ * fStack_8ac + local_c28 * fStack_88c) - fVar75;
        fVar76 = fVar76 - fVar75;
        fVar89 = fVar89 - fVar75;
        fVar91 = fVar91 - fVar75;
        fVar93 = fVar93 - fVar75;
        fVar180 = local_8a8 - fVar75;
        fVar181 = fStack_8a4 - fVar75;
        fVar182 = fStack_8a0 - fVar75;
        fVar75 = fStack_89c - fVar75;
        fVar173 = fVar180 - fVar176;
        fVar175 = fVar181 - fVar126;
        fStack_ca0 = fVar182 - fStack_c10;
        fStack_c9c = fVar75 - fStack_c0c;
        fVar165 = local_b78 - fVar157;
        fVar166 = fStack_b74 - fVar159;
        fVar167 = fStack_b70 - fVar160;
        fVar178 = fStack_b6c - fStack_b2c;
        fVar141 = local_b68 - fVar131;
        fVar143 = fStack_b64 - fVar132;
        fVar147 = fStack_b60 - fVar133;
        fVar155 = fStack_b5c - fStack_b1c;
        fVar77 = local_b18 - local_b78;
        fVar94 = fStack_b14 - fStack_b74;
        fVar154 = fStack_b10 - fStack_b70;
        fVar171 = fStack_b0c - fStack_b6c;
        fVar90 = (float)local_c98 - local_b68;
        fVar151 = local_c98._4_4_ - fStack_b64;
        fStack_d00 = fStack_c90 - fStack_b60;
        fStack_cfc = fStack_c8c - fStack_b5c;
        local_c58 = CONCAT44(fVar166,fVar165);
        uStack_c50 = CONCAT44(fVar178,fVar167);
        fVar92 = fVar176 - fVar76;
        fVar153 = fVar126 - fVar89;
        fVar119 = fStack_c10 - fVar91;
        fVar125 = fStack_c0c - fVar93;
        fVar139 = (fVar165 * (local_b68 + fVar131) - (local_b78 + fVar157) * fVar141) * fStack_c6c +
                  ((fVar180 + fVar176) * fVar141 - (local_b68 + fVar131) * fVar173) * fStack_c60 +
                  (fVar173 * (local_b78 + fVar157) - (fVar180 + fVar176) * fVar165) * fVar183;
        fVar140 = (fVar166 * (fStack_b64 + fVar132) - (fStack_b74 + fVar159) * fVar143) * fStack_c6c
                  + ((fVar181 + fVar126) * fVar143 - (fStack_b64 + fVar132) * fVar175) * fStack_c60
                    + (fVar175 * (fStack_b74 + fVar159) - (fVar181 + fVar126) * fVar166) * fVar183;
        local_c48 = CONCAT44(fVar140,fVar139);
        fStack_c40 = (fVar167 * (fStack_b60 + fVar133) - (fStack_b70 + fVar160) * fVar147) *
                     fStack_c6c +
                     ((fVar182 + fStack_c10) * fVar147 - (fStack_b60 + fVar133) * fStack_ca0) *
                     fStack_c60 +
                     (fStack_ca0 * (fStack_b70 + fVar160) - (fVar182 + fStack_c10) * fVar167) *
                     fVar183;
        register0x0000140c =
             (fVar178 * (fStack_b5c + fStack_b1c) - (fStack_b6c + fStack_b2c) * fVar155) *
             fStack_c6c +
             ((fVar75 + fStack_c0c) * fVar155 - (fStack_b5c + fStack_b1c) * fStack_c9c) * fStack_c60
             + (fStack_c9c * (fStack_b6c + fStack_b2c) - (fVar75 + fStack_c0c) * fVar178) * fVar183;
        fVar142 = fVar157 - local_b18;
        fVar146 = fVar159 - fStack_b14;
        fVar148 = fVar160 - fStack_b10;
        fVar156 = fStack_b2c - fStack_b0c;
        fVar134 = fVar131 - (float)local_c98;
        fVar136 = fVar132 - local_c98._4_4_;
        fVar137 = fVar133 - fStack_c90;
        fVar138 = fStack_b1c - fStack_c8c;
        scene = (Scene *)CONCAT44(fVar126,fVar176);
        local_c28 = (fVar142 * ((float)local_c98 + fVar131) - (local_b18 + fVar157) * fVar134) *
                    fStack_c6c +
                    ((fVar176 + fVar76) * fVar134 - ((float)local_c98 + fVar131) * fVar92) *
                    fStack_c60 +
                    (fVar92 * (local_b18 + fVar157) - (fVar176 + fVar76) * fVar142) * fVar183;
        fStack_c24 = (fVar146 * (local_c98._4_4_ + fVar132) - (fStack_b14 + fVar159) * fVar136) *
                     fStack_c6c +
                     ((fVar126 + fVar89) * fVar136 - (local_c98._4_4_ + fVar132) * fVar153) *
                     fStack_c60 +
                     (fVar153 * (fStack_b14 + fVar159) - (fVar126 + fVar89) * fVar146) * fVar183;
        fStack_c20 = (fVar148 * (fStack_c90 + fVar133) - (fStack_b10 + fVar160) * fVar137) *
                     fStack_c6c +
                     ((fStack_c10 + fVar91) * fVar137 - (fStack_c90 + fVar133) * fVar119) *
                     fStack_c60 +
                     (fVar119 * (fStack_b10 + fVar160) - (fStack_c10 + fVar91) * fVar148) * fVar183;
        fStack_c1c = (fVar156 * (fStack_c8c + fStack_b1c) - (fStack_b0c + fStack_b2c) * fVar138) *
                     fStack_c6c +
                     ((fStack_c0c + fVar93) * fVar138 - (fStack_c8c + fStack_b1c) * fVar125) *
                     fStack_c60 +
                     (fVar125 * (fStack_b0c + fStack_b2c) - (fStack_c0c + fVar93) * fVar156) *
                     fVar183;
        fVar161 = fVar76 - fVar180;
        fVar162 = fVar89 - fVar181;
        fVar163 = fVar91 - fVar182;
        fVar164 = fVar93 - fVar75;
        _local_c68 = CONCAT44(fStack_c60,fStack_c60);
        auVar84._0_4_ =
             (fVar77 * local_b48 - local_b58 * fVar90) * fStack_c6c +
             ((fVar180 + fVar76) * fVar90 - local_b48 * fVar161) * fStack_c60 +
             (fVar161 * local_b58 - (fVar180 + fVar76) * fVar77) * fVar183;
        auVar84._4_4_ =
             (fVar94 * fStack_b44 - fStack_b54 * fVar151) * fStack_c6c +
             ((fVar181 + fVar89) * fVar151 - fStack_b44 * fVar162) * fStack_c60 +
             (fVar162 * fStack_b54 - (fVar181 + fVar89) * fVar94) * fVar183;
        auVar84._8_4_ =
             (fVar154 * fStack_b40 - fStack_b50 * fStack_d00) * fStack_c6c +
             ((fVar182 + fVar91) * fStack_d00 - fStack_b40 * fVar163) * fStack_c60 +
             (fVar163 * fStack_b50 - (fVar182 + fVar91) * fVar154) * fVar183;
        auVar84._12_4_ =
             (fVar171 * fStack_b3c - fStack_b4c * fStack_cfc) * fStack_c6c +
             ((fVar75 + fVar93) * fStack_cfc - fStack_b3c * fVar164) * fStack_c60 +
             (fVar164 * fStack_b4c - (fVar75 + fVar93) * fVar171) * fVar183;
        local_c38 = fVar139 + local_c28 + auVar84._0_4_;
        fStack_c34 = fVar140 + fStack_c24 + auVar84._4_4_;
        fStack_c30 = fStack_c40 + fStack_c20 + auVar84._8_4_;
        fStack_c2c = register0x0000140c + fStack_c1c + auVar84._12_4_;
        auVar102._8_4_ = fStack_c40;
        auVar102._0_8_ = local_c48;
        auVar102._12_4_ = register0x0000140c;
        auVar43._4_4_ = fStack_c24;
        auVar43._0_4_ = local_c28;
        auVar43._8_4_ = fStack_c20;
        auVar43._12_4_ = fStack_c1c;
        auVar109 = minps(auVar102,auVar43);
        auVar109 = minps(auVar109,auVar84);
        auVar169._8_4_ = fStack_c40;
        auVar169._0_8_ = local_c48;
        auVar169._12_4_ = register0x0000140c;
        auVar44._4_4_ = fStack_c24;
        auVar44._0_4_ = local_c28;
        auVar44._8_4_ = fStack_c20;
        auVar44._12_4_ = fStack_c1c;
        auVar122 = maxps(auVar169,auVar44);
        auVar122 = maxps(auVar122,auVar84);
        fVar93 = (float)((uint)local_c38 & auVar95._0_4_);
        fVar180 = (float)((uint)fStack_c34 & auVar95._4_4_);
        fVar181 = (float)((uint)fStack_c30 & auVar95._8_4_);
        fVar182 = (float)((uint)fStack_c2c & auVar95._12_4_);
        fVar75 = fVar93 * 1.1920929e-07;
        fVar76 = fVar180 * 1.1920929e-07;
        fVar89 = fVar181 * 1.1920929e-07;
        fVar91 = fVar182 * 1.1920929e-07;
        auVar170._4_4_ = -(uint)(auVar122._4_4_ <= fVar76);
        auVar170._0_4_ = -(uint)(auVar122._0_4_ <= fVar75);
        auVar170._8_4_ = -(uint)(auVar122._8_4_ <= fVar89);
        auVar170._12_4_ = -(uint)(auVar122._12_4_ <= fVar91);
        auVar103._4_4_ = -(uint)(-fVar76 <= auVar109._4_4_);
        auVar103._0_4_ = -(uint)(-fVar75 <= auVar109._0_4_);
        auVar103._8_4_ = -(uint)(-fVar89 <= auVar109._8_4_);
        auVar103._12_4_ = -(uint)(-fVar91 <= auVar109._12_4_);
        auVar170 = auVar170 | auVar103;
        iVar63 = movmskps((int)pSVar55,auVar170);
        if (iVar63 != 0) {
          auVar150._0_4_ = fVar165 * fVar134 - fVar142 * fVar141;
          auVar150._4_4_ = fVar166 * fVar136 - fVar146 * fVar143;
          auVar150._8_4_ = fVar167 * fVar137 - fVar148 * fVar147;
          auVar150._12_4_ = fVar178 * fVar138 - fVar156 * fVar155;
          auVar152._0_4_ = fVar142 * fVar90 - fVar77 * fVar134;
          auVar152._4_4_ = fVar146 * fVar151 - fVar94 * fVar136;
          auVar152._8_4_ = fVar148 * fStack_d00 - fVar154 * fVar137;
          auVar152._12_4_ = fVar156 * fStack_cfc - fVar171 * fVar138;
          auVar85._4_4_ = -(uint)(ABS(fVar146 * fVar143) < ABS(fVar94 * fVar136));
          auVar85._0_4_ = -(uint)(ABS(fVar142 * fVar141) < ABS(fVar77 * fVar134));
          auVar85._8_4_ = -(uint)(ABS(fVar148 * fVar147) < ABS(fVar154 * fVar137));
          auVar85._12_4_ = -(uint)(ABS(fVar156 * fVar155) < ABS(fVar171 * fVar138));
          fVar172 = (float)DAT_01f7ba10;
          fVar174 = DAT_01f7ba10._4_4_;
          fVar177 = DAT_01f7ba10._12_4_;
          local_a68 = blendvps(auVar152,auVar150,auVar85);
          auVar123._0_4_ = fVar141 * fVar92 - fVar173 * fVar134;
          auVar123._4_4_ = fVar143 * fVar153 - fVar175 * fVar136;
          auVar123._8_4_ = fVar147 * fVar119 - fStack_ca0 * fVar137;
          auVar123._12_4_ = fVar155 * fVar125 - fStack_c9c * fVar138;
          auVar158._0_4_ = fVar161 * fVar134 - fVar92 * fVar90;
          auVar158._4_4_ = fVar162 * fVar136 - fVar153 * fVar151;
          auVar158._8_4_ = fVar163 * fVar137 - fVar119 * fStack_d00;
          auVar158._12_4_ = fVar164 * fVar138 - fVar125 * fStack_cfc;
          auVar86._4_4_ = -(uint)(ABS(fVar175 * fVar136) < ABS(fVar153 * fVar151));
          auVar86._0_4_ = -(uint)(ABS(fVar173 * fVar134) < ABS(fVar92 * fVar90));
          auVar86._8_4_ = -(uint)(ABS(fStack_ca0 * fVar137) < ABS(fVar119 * fStack_d00));
          auVar86._12_4_ = -(uint)(ABS(fStack_c9c * fVar138) < ABS(fVar125 * fStack_cfc));
          local_a58 = blendvps(auVar158,auVar123,auVar86);
          auVar124._0_4_ = fVar92 * fVar77 - fVar161 * fVar142;
          auVar124._4_4_ = fVar153 * fVar94 - fVar162 * fVar146;
          auVar124._8_4_ = fVar119 * fVar154 - fVar163 * fVar148;
          auVar124._12_4_ = fVar125 * fVar171 - fVar164 * fVar156;
          auVar87._4_4_ = -(uint)(ABS(fVar153 * fVar166) < ABS(fVar162 * fVar146));
          auVar87._0_4_ = -(uint)(ABS(fVar92 * fVar165) < ABS(fVar161 * fVar142));
          auVar87._8_4_ = -(uint)(ABS(fVar119 * fVar167) < ABS(fVar163 * fVar148));
          auVar87._12_4_ = -(uint)(ABS(fVar125 * fVar178) < ABS(fVar164 * fVar156));
          auVar41._4_4_ = fVar175 * fVar146 - fVar153 * fVar166;
          auVar41._0_4_ = fVar173 * fVar142 - fVar92 * fVar165;
          auVar41._8_4_ = fStack_ca0 * fVar148 - fVar119 * fVar167;
          auVar41._12_4_ = fStack_c9c * fVar156 - fVar125 * fVar178;
          local_a48 = blendvps(auVar124,auVar41,auVar87);
          fVar75 = fStack_c6c * local_a68._0_4_ +
                   fStack_c60 * local_a58._0_4_ + fVar183 * local_a48._0_4_;
          fVar76 = fStack_c6c * local_a68._4_4_ +
                   fStack_c60 * local_a58._4_4_ + fVar183 * local_a48._4_4_;
          fVar77 = fStack_c6c * local_a68._8_4_ +
                   fStack_c60 * local_a58._8_4_ + fVar183 * local_a48._8_4_;
          fVar183 = fStack_c6c * local_a68._12_4_ +
                    fStack_c60 * local_a58._12_4_ + fVar183 * local_a48._12_4_;
          auVar130._0_4_ = fVar75 + fVar75;
          auVar130._4_4_ = fVar76 + fVar76;
          auVar130._8_4_ = fVar77 + fVar77;
          auVar130._12_4_ = fVar183 + fVar183;
          auVar104._0_4_ = fVar131 * local_a48._0_4_;
          auVar104._4_4_ = fVar132 * local_a48._4_4_;
          auVar104._8_4_ = fVar133 * local_a48._8_4_;
          auVar104._12_4_ = fStack_b1c * local_a48._12_4_;
          fVar90 = fVar176 * local_a68._0_4_ + fVar157 * local_a58._0_4_ + auVar104._0_4_;
          fVar91 = fVar126 * local_a68._4_4_ + fVar159 * local_a58._4_4_ + auVar104._4_4_;
          fVar92 = fStack_c10 * local_a68._8_4_ + fVar160 * local_a58._8_4_ + auVar104._8_4_;
          fVar94 = fStack_c0c * local_a68._12_4_ + fStack_b2c * local_a58._12_4_ + auVar104._12_4_;
          auVar95 = rcpps(auVar104,auVar130);
          fVar75 = auVar95._0_4_;
          fVar183 = auVar95._4_4_;
          fVar77 = auVar95._8_4_;
          fVar89 = auVar95._12_4_;
          fVar76 = DAT_01f7ba10._8_4_;
          local_a78._0_4_ =
               ((fVar172 - auVar130._0_4_ * fVar75) * fVar75 + fVar75) * (fVar90 + fVar90);
          local_a78._4_4_ =
               ((fVar174 - auVar130._4_4_ * fVar183) * fVar183 + fVar183) * (fVar91 + fVar91);
          fStack_a70 = ((fVar76 - auVar130._8_4_ * fVar77) * fVar77 + fVar77) * (fVar92 + fVar92);
          fStack_a6c = ((fVar177 - auVar130._12_4_ * fVar89) * fVar89 + fVar89) * (fVar94 + fVar94);
          fVar75 = *(float *)(ray + k * 4 + 0x80);
          fVar183 = *(float *)(ray + k * 4 + 0x30);
          auVar114._4_4_ = -(uint)(fVar183 <= (float)local_a78._4_4_);
          auVar114._0_4_ = -(uint)(fVar183 <= (float)local_a78._0_4_);
          auVar114._8_4_ = -(uint)(fVar183 <= fStack_a70);
          auVar114._12_4_ = -(uint)(fVar183 <= fStack_a6c);
          auVar105._0_4_ =
               -(uint)((float)local_a78._0_4_ <= fVar75 && fVar183 <= (float)local_a78._0_4_) &
               auVar170._0_4_;
          auVar105._4_4_ =
               -(uint)((float)local_a78._4_4_ <= fVar75 && fVar183 <= (float)local_a78._4_4_) &
               auVar170._4_4_;
          auVar105._8_4_ = -(uint)(fStack_a70 <= fVar75 && fVar183 <= fStack_a70) & auVar170._8_4_;
          auVar105._12_4_ = -(uint)(fStack_a6c <= fVar75 && fVar183 <= fStack_a6c) & auVar170._12_4_
          ;
          iVar63 = movmskps(iVar63,auVar105);
          fStack_d10 = fVar119;
          fStack_d0c = fVar125;
          if ((iVar63 != 0) &&
             (auVar106._0_4_ = auVar105._0_4_ & -(uint)(auVar130._0_4_ != 0.0),
             auVar106._4_4_ = auVar105._4_4_ & -(uint)(auVar130._4_4_ != 0.0),
             auVar106._8_4_ = auVar105._8_4_ & -(uint)(auVar130._8_4_ != 0.0),
             auVar106._12_4_ = auVar105._12_4_ & -(uint)(auVar130._12_4_ != 0.0),
             uVar58 = movmskps(iVar63,auVar106), uVar58 != 0)) {
            auVar51._4_4_ = fStack_c34;
            auVar51._0_4_ = local_c38;
            auVar51._8_4_ = fStack_c30;
            auVar51._12_4_ = fStack_c2c;
            local_a38 = local_888;
            pSVar55 = context->scene;
            auVar95 = rcpps(auVar114,auVar51);
            fVar183 = auVar95._0_4_;
            fVar77 = auVar95._4_4_;
            fVar89 = auVar95._8_4_;
            fVar90 = auVar95._12_4_;
            fVar183 = (float)(-(uint)(1e-18 <= fVar93) &
                             (uint)((fVar172 - local_c38 * fVar183) * fVar183 + fVar183));
            fVar77 = (float)(-(uint)(1e-18 <= fVar180) &
                            (uint)((fVar174 - fStack_c34 * fVar77) * fVar77 + fVar77));
            fVar89 = (float)(-(uint)(1e-18 <= fVar181) &
                            (uint)((fVar76 - fStack_c30 * fVar89) * fVar89 + fVar89));
            fVar90 = (float)(-(uint)(1e-18 <= fVar182) &
                            (uint)((fVar177 - fStack_c2c * fVar90) * fVar90 + fVar90));
            auVar145._0_4_ = fVar139 * fVar183;
            auVar145._4_4_ = fVar140 * fVar77;
            auVar145._8_4_ = fStack_c40 * fVar89;
            auVar145._12_4_ = register0x0000140c * fVar90;
            auVar95 = minps(auVar145,_DAT_01f7ba10);
            auVar185._0_4_ = fVar183 * local_c28;
            auVar185._4_4_ = fVar77 * fStack_c24;
            auVar185._8_4_ = fVar89 * fStack_c20;
            auVar185._12_4_ = fVar90 * fStack_c1c;
            auVar109 = minps(auVar185,_DAT_01f7ba10);
            auVar107._0_4_ = fVar172 - auVar95._0_4_;
            auVar107._4_4_ = fVar174 - auVar95._4_4_;
            auVar107._8_4_ = fVar76 - auVar95._8_4_;
            auVar107._12_4_ = fVar177 - auVar95._12_4_;
            auVar115._0_4_ = fVar172 - auVar109._0_4_;
            auVar115._4_4_ = fVar174 - auVar109._4_4_;
            auVar115._8_4_ = fVar76 - auVar109._8_4_;
            auVar115._12_4_ = fVar177 - auVar109._12_4_;
            local_a98 = blendvps(auVar95,auVar107,local_888);
            local_a88 = blendvps(auVar109,auVar115,local_888);
            uVar70 = (ulong)(uVar58 & 0xff);
            local_c78 = fStack_c6c;
            fStack_c74 = fStack_c6c;
            fStack_c70 = fStack_c6c;
            fStack_c5c = fStack_c60;
            do {
              uVar56 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                }
              }
              local_9c8 = *(uint *)(lVar29 + 0x40 + uVar56 * 4);
              pGVar27 = (pSVar55->geometries).items[local_9c8].ptr;
              if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0028550c:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar74;
                }
                local_9f8 = *(undefined4 *)(local_a98 + uVar56 * 4);
                uVar24 = *(undefined4 *)(local_a88 + uVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a78 + uVar56 * 4);
                args.context = context->user;
                uVar25 = *(undefined4 *)(lVar29 + 0x50 + uVar56 * 4);
                local_9d8._4_4_ = uVar25;
                local_9d8._0_4_ = uVar25;
                local_9d8._8_4_ = uVar25;
                local_9d8._12_4_ = uVar25;
                local_9e8._4_4_ = uVar24;
                local_9e8._0_4_ = uVar24;
                local_9e8._8_4_ = uVar24;
                local_9e8._12_4_ = uVar24;
                uVar24 = *(undefined4 *)(local_a68 + uVar56 * 4);
                local_a18._4_4_ = *(undefined4 *)(local_a58 + uVar56 * 4);
                local_a08._4_4_ = *(undefined4 *)(local_a48 + uVar56 * 4);
                local_a28._4_4_ = uVar24;
                local_a28._0_4_ = uVar24;
                local_a28._8_4_ = uVar24;
                local_a28._12_4_ = uVar24;
                local_a18._0_4_ = local_a18._4_4_;
                local_a18._8_4_ = local_a18._4_4_;
                local_a18._12_4_ = local_a18._4_4_;
                local_a08._0_4_ = local_a08._4_4_;
                local_a08._8_4_ = local_a08._4_4_;
                local_a08._12_4_ = local_a08._4_4_;
                uStack_9f4 = local_9f8;
                uStack_9f0 = local_9f8;
                uStack_9ec = local_9f8;
                uStack_9c4 = local_9c8;
                uStack_9c0 = local_9c8;
                uStack_9bc = local_9c8;
                local_9b8 = (args.context)->instID[0];
                uStack_9b4 = local_9b8;
                uStack_9b0 = local_9b8;
                uStack_9ac = local_9b8;
                local_9a8 = (args.context)->instPrimID[0];
                uStack_9a4 = local_9a8;
                uStack_9a0 = local_9a8;
                uStack_99c = local_9a8;
                local_c88 = *local_c00;
                args.valid = (int *)local_c88;
                args.geometryUserPtr = pGVar27->userPtr;
                args.hit = (RTCHitN *)local_a28;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar27->occlusionFilterN)(&args);
                }
                if (local_c88 == (undefined1  [16])0x0) {
                  auVar108._8_4_ = 0xffffffff;
                  auVar108._0_8_ = 0xffffffffffffffff;
                  auVar108._12_4_ = 0xffffffff;
                  auVar108 = auVar108 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var35 = context->args->filter;
                  if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar27->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var35)(&args);
                  }
                  auVar88._0_4_ = -(uint)(local_c88._0_4_ == 0);
                  auVar88._4_4_ = -(uint)(local_c88._4_4_ == 0);
                  auVar88._8_4_ = -(uint)(local_c88._8_4_ == 0);
                  auVar88._12_4_ = -(uint)(local_c88._12_4_ == 0);
                  auVar108 = auVar88 ^ _DAT_01f7ae20;
                  auVar95 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar88);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar95;
                }
                if ((_DAT_01f7bb20 & auVar108) != (undefined1  [16])0x0) goto LAB_0028550c;
                *(float *)(ray + k * 4 + 0x80) = fVar75;
                fStack_d00 = 0.0;
                fStack_cfc = 0.0;
              }
              uVar70 = uVar70 ^ 1L << (uVar56 & 0x3f);
            } while (uVar70 != 0);
          }
        }
        pauVar59 = (undefined1 (*) [16])(*pauVar59 + 1);
      } while (pauVar59 != (undefined1 (*) [16])(uVar53 - 8));
    }
LAB_002854ec:
    bVar74 = pNVar68 != stack;
    if (!bVar74) {
      return bVar74;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }